

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_1::VertexExpanderShader::shadePrimitives
          (VertexExpanderShader *this,GeometryEmitter *output,int verticesIn,
          PrimitivePacket *packets,int numPackets,int invocationID)

{
  int iVar1;
  Vector<float,_4> local_f0;
  Vec4 local_e0;
  Vector<float,_4> local_d0;
  Vec4 local_c0;
  Vector<float,_4> local_b0;
  Vec4 local_a0;
  VertexPacket *local_90;
  VertexPacket *vertex;
  undefined1 local_78 [8];
  Vec4 yoffset;
  Vec4 offsets [3];
  int verticeNdx;
  int ndx;
  int invocationID_local;
  int numPackets_local;
  PrimitivePacket *packets_local;
  int verticesIn_local;
  GeometryEmitter *output_local;
  VertexExpanderShader *this_local;
  
  for (offsets[2].m_data[3] = 0.0; (int)offsets[2].m_data[3] < numPackets;
      offsets[2].m_data[3] = (float)((int)offsets[2].m_data[3] + 1)) {
    for (offsets[2].m_data[2] = 0.0; (int)offsets[2].m_data[2] < verticesIn;
        offsets[2].m_data[2] = (float)((int)offsets[2].m_data[2] + 1)) {
      tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(yoffset.m_data + 2),-0.07,-0.01,0.0,0.0);
      tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(offsets[0].m_data + 2),0.03,-0.03,0.0,0.0);
      tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(offsets[1].m_data + 2),-0.01,0.08,0.0,0.0);
      iVar1 = packets[(int)offsets[2].m_data[3]].primitiveIDIn;
      tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&vertex,0.02,0.1,0.0,0.0);
      tcu::operator*((tcu *)local_78,(float)iVar1,(Vector<float,_4> *)&vertex);
      local_90 = packets[(int)offsets[2].m_data[3]].vertices[(int)offsets[2].m_data[2]];
      tcu::operator+((tcu *)&local_b0,&local_90->position,(Vector<float,_4> *)(yoffset.m_data + 2));
      tcu::operator+((tcu *)&local_a0,&local_b0,(Vector<float,_4> *)local_78);
      rr::GeometryEmitter::EmitVertex
                (output,&local_a0,local_90->pointSize,local_90->outputs,
                 packets[(int)offsets[2].m_data[3]].primitiveIDIn);
      tcu::operator+((tcu *)&local_d0,&local_90->position,
                     (Vector<float,_4> *)(offsets[0].m_data + 2));
      tcu::operator+((tcu *)&local_c0,&local_d0,(Vector<float,_4> *)local_78);
      rr::GeometryEmitter::EmitVertex
                (output,&local_c0,local_90->pointSize,local_90->outputs,
                 packets[(int)offsets[2].m_data[3]].primitiveIDIn);
      tcu::operator+((tcu *)&local_f0,&local_90->position,
                     (Vector<float,_4> *)(offsets[1].m_data + 2));
      tcu::operator+((tcu *)&local_e0,&local_f0,(Vector<float,_4> *)local_78);
      rr::GeometryEmitter::EmitVertex
                (output,&local_e0,local_90->pointSize,local_90->outputs,
                 packets[(int)offsets[2].m_data[3]].primitiveIDIn);
      rr::GeometryEmitter::EndPrimitive(output);
    }
  }
  return;
}

Assistant:

void VertexExpanderShader::shadePrimitives (rr::GeometryEmitter& output, int verticesIn, const rr::PrimitivePacket* packets, const int numPackets, int invocationID) const
{
	DE_UNREF(invocationID);

	for (int ndx = 0; ndx < numPackets; ++ndx)
	for (int verticeNdx = 0; verticeNdx < verticesIn; ++verticeNdx)
	{
		const tcu::Vec4 offsets[] =
		{
			tcu::Vec4(-0.07f, -0.01f, 0.0f, 0.0f),
			tcu::Vec4( 0.03f, -0.03f, 0.0f, 0.0f),
			tcu::Vec4(-0.01f,  0.08f, 0.0f, 0.0f)
		};
		const tcu::Vec4 yoffset = float(packets[ndx].primitiveIDIn) * tcu::Vec4(0.02f, 0.1f, 0, 0);

		// Create new primitive at every input vertice
		const rr::VertexPacket* vertex = packets[ndx].vertices[verticeNdx];

		output.EmitVertex(vertex->position + offsets[0] + yoffset, vertex->pointSize, vertex->outputs, packets[ndx].primitiveIDIn);
		output.EmitVertex(vertex->position + offsets[1] + yoffset, vertex->pointSize, vertex->outputs, packets[ndx].primitiveIDIn);
		output.EmitVertex(vertex->position + offsets[2] + yoffset, vertex->pointSize, vertex->outputs, packets[ndx].primitiveIDIn);
		output.EndPrimitive();
	}
}